

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O1

int main(void)

{
  Logger *pLVar1;
  size_t sVar2;
  shared_ptr<Chunk> sp_chunk;
  vector<Chunk_*,_std::allocator<Chunk_*>_> chunks;
  string s;
  undefined1 local_69;
  shared_ptr<Chunk> local_68;
  vector<Chunk_*,_std::allocator<Chunk_*>_> local_58;
  long *local_38 [2];
  long local_28 [2];
  
  pLVar1 = Logger::get_instance();
  Logger::init(pLVar1,(EVP_PKEY_CTX *)0x0);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x3e);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x3e,LOG_LEVEL_INFO,"===================before alloc...\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38[0] = (long *)CONCAT44(local_38[0]._4_4_,10);
  local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Chunk,std::allocator<Chunk>,int>
            (&local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Chunk **)&local_68,(allocator<Chunk> *)&local_69,(int *)local_38);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"hello","");
  strcpy((local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data,
         (char *)local_38[0]);
  sVar2 = strlen((char *)local_38[0]);
  (local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->length = (int)sVar2;
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4b);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4b,LOG_LEVEL_INFO,"===================start to alloc...\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m4K,1000);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4d);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4d,LOG_LEVEL_INFO,"alloc 1000 chunks, chunk size: %dkb\n",4);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m16K,1000);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4f);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4f,LOG_LEVEL_INFO,"alloc 1000 chunks, chunk size: %dkb\n",0x10);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m64K,500);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x51);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x51,LOG_LEVEL_INFO,"alloc 500 chunks, chunk size: %dkb\n",0x40);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m256K,0x1e);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x53);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x53,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x100);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m1M,0x1e);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x55);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x55,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x400);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  alloc_and_fill(&local_68,&local_58,m4M,0x1e);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x57);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x57,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x1000);
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x59);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x59,LOG_LEVEL_INFO,"===================after alloc...\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x5f);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x5f,LOG_LEVEL_INFO,"===================start to retrieve...\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  retrieve_chunks(&local_58);
  pLVar1 = Logger::get_instance();
  if ((pLVar1->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x62);
  }
  if (1 < (int)g_log_level) {
    pLVar1 = Logger::get_instance();
    Logger::write_log(pLVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x62,LOG_LEVEL_INFO,"===================after retrieve...\n");
    pLVar1 = Logger::get_instance();
    Logger::flush(pLVar1);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Chunk_*,_std::allocator<Chunk_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    Logger::get_instance()->init(NULL);

    LOG_INFO("===================before alloc...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    vector<Chunk*> chunks;

    shared_ptr<Chunk> sp_chunk = make_shared<Chunk>(10);
    string s = "hello";
    strcpy(sp_chunk->data, s.c_str());
    sp_chunk->length = strlen(s.c_str());

    LOG_INFO("===================start to alloc...\n");
    alloc_and_fill(sp_chunk, chunks, m4K, 1000);
    LOG_INFO("alloc 1000 chunks, chunk size: %dkb\n", m4K/1024);
    alloc_and_fill(sp_chunk, chunks, m16K, 1000);   
    LOG_INFO("alloc 1000 chunks, chunk size: %dkb\n", m16K/1024);
    alloc_and_fill(sp_chunk, chunks, m64K, 500);
    LOG_INFO("alloc 500 chunks, chunk size: %dkb\n", m64K/1024);
    alloc_and_fill(sp_chunk, chunks, m256K, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m256K/1024);
    alloc_and_fill(sp_chunk, chunks, m1M, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m1M/1024);
    alloc_and_fill(sp_chunk, chunks, m4M, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m4M/1024);

    LOG_INFO("===================after alloc...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    LOG_INFO("===================start to retrieve...\n");
    retrieve_chunks(chunks);

    LOG_INFO("===================after retrieve...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    return 0;
}